

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O0

void __thiscall
linq::IEnumerableCore<linq::IEnumerable<int_&>_>::iterator::iterator
          (iterator *this,IEnumerable<int_&> *src,bool v)

{
  bool bVar1;
  bool v_local;
  IEnumerable<int_&> *src_local;
  iterator *this_local;
  
  IEnumerable<int_&>::IEnumerable(&this->source,src);
  this->valid = false;
  this->valid = v;
  if (v) {
    IEnumerable<int_&>::Init(&this->source);
    bVar1 = IEnumerable<int_&>::Valid(&this->source);
    this->valid = bVar1;
  }
  return;
}

Assistant:

iterator(S src, bool v = true) : source(src) {
				valid = v;
				
				if(v) { 
					source.Init();	
					valid = source.Valid();
				}
			}